

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void raviV_op_setlist(lua_State *L,CallInfo *ci,TValue *ra,int b,int c)

{
  uint uVar1;
  LuaType LVar2;
  Table *t;
  RaviArray *t_00;
  bool bVar3;
  int iVar4;
  lua_Integer value;
  uint ukey;
  uint uVar5;
  char *pcVar6;
  TValue *pTVar7;
  ulong uVar8;
  double dVar9;
  lua_Number value_00;
  undefined1 auVar10 [16];
  
  if (b == 0) {
    b = (int)((ulong)((long)L->top - (long)ra) >> 4) - 1;
  }
  iVar4 = c * 0x32;
  LVar2 = ra->tt_;
  uVar5 = iVar4 + -0x32 + b;
  uVar1 = iVar4 - 0x32;
  if ((LVar2 == 0x8025) || (LVar2 == 0x8015)) {
    t_00 = (RaviArray *)(ra->value_).gc;
    if ((t_00->tt != '\x15') && (t_00->tt != '%')) {
      pcVar6 = 
      "((((ra)->value_).gc)->tt == ((5) | ((1) << 4)) || (((ra)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_001499a1;
    }
    if (iVar4 + -0x31 <= (int)uVar5) {
      uVar5 = uVar1 | 1;
      pTVar7 = ra + (long)(int)uVar1 + 1;
      do {
        LVar2 = pTVar7->tt_;
        if ((t_00->flags & 8) == 0) {
          if (LVar2 == 3) {
            auVar10._8_8_ = 0;
            auVar10._0_8_ = (pTVar7->value_).n;
            auVar10 = vroundsd_avx(auVar10,auVar10,9);
            dVar9 = auVar10._0_8_;
            if (((dVar9 == (pTVar7->value_).n) && (-9.223372036854776e+18 <= dVar9)) &&
               (dVar9 < 9.223372036854776e+18)) {
              value = (lua_Integer)dVar9;
              goto LAB_001498e6;
            }
          }
          else if (LVar2 == 0x13) {
            value = (pTVar7->value_).i;
LAB_001498e6:
            if (uVar5 < t_00->len) {
              *(lua_Integer *)(t_00->data + (ulong)uVar5 * 8) = value;
            }
            else {
              raviH_set_int(L,t_00,(ulong)uVar5,value);
            }
            goto LAB_00149931;
          }
          pcVar6 = "value cannot be converted to integer";
LAB_00149968:
          luaG_runerror(L,pcVar6);
        }
        if (LVar2 == 0x13) {
          value_00 = (lua_Number)(pTVar7->value_).i;
        }
        else {
          if (LVar2 != 3) {
            pcVar6 = "value cannot be converted to number";
            goto LAB_00149968;
          }
          value_00 = (pTVar7->value_).n;
        }
        if (uVar5 < t_00->len) {
          *(lua_Number *)(t_00->data + (ulong)uVar5 * 8) = value_00;
        }
        else {
          raviH_set_float(L,t_00,(ulong)uVar5,value_00);
        }
LAB_00149931:
        uVar5 = uVar5 + 1;
        pTVar7 = pTVar7 + 1;
        b = b - 1;
      } while (b != 0);
    }
  }
  else {
    if (LVar2 != 0x8005) {
      pcVar6 = 
      "(((((ra))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((ra))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_001499a1:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb08,"void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
    }
    t = (Table *)(ra->value_).gc;
    if (t->tt != '\x05') {
      __assert_fail("(((ra)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xafe,"void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
    }
    if (t->sizearray < uVar5) {
      luaH_resizearray(L,t,uVar5);
    }
    if (0 < b) {
      pTVar7 = ra + (uint)b;
      uVar8 = (ulong)(uint)b;
      do {
        luaH_setint(L,t,(ulong)(uVar1 + (int)uVar8),pTVar7);
        if ((short)pTVar7->tt_ < 0) {
          if (9 < (t->tt & 0xe)) {
            __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0xb04,
                          "void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
          }
          if (((t->marked & 0x20) != 0) && ((((pTVar7->value_).gc)->marked & 0x18) != 0)) {
            luaC_barrierback_(L,(GCObject *)t);
          }
        }
        pTVar7 = pTVar7 + -1;
        bVar3 = 1 < (long)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar3);
    }
  }
  L->top = ci->top;
  return;
}

Assistant:

void raviV_op_setlist(lua_State *L, CallInfo *ci, TValue *ra, int b, int c) {
  int n = b;
  unsigned int last;
  if (n == 0)
    n = cast_int(L->top - ra) - 1;
  last = ((c - 1) * LFIELDS_PER_FLUSH) + n;
  if (ttisLtable(ra)) {
    Table *h = hvalue(ra);
    if (last > h->sizearray)        /* needs more space? */
      luaH_resizearray(L, h, last); /* pre-allocate it at once */
    for (; n > 0; n--) {
      TValue *val = ra + n;
      luaH_setint(L, h, last--, val);
      luaC_barrierback(L, obj2gco(h), val);
    }
  }
  else {
    RaviArray *h = arrvalue(ra);
    int i = last - n + 1;
    for (; i <= (int)last; i++) {
      TValue *val = ra + i;
      unsigned int u = (unsigned int)(i);
      if ((h->flags & RAVI_ARRAY_ISFLOAT) == 0) {
        if (ttisinteger(val)) {
          raviH_set_int_inline(L, h, u, ivalue(val));
        }
        else {
          lua_Integer i = 0;
          if (tointegerns(val, &i)) {
            raviH_set_int_inline(L, h, u, i);
          }
          else
            luaG_runerror(L, "value cannot be converted to integer");
        }
      }
      else {
        if (ttisfloat(val)) {
          raviH_set_float_inline(L, h, u, fltvalue(val));
        }
        else if (ttisinteger(val)) {
          raviH_set_float_inline(L, h, u, (lua_Number)(ivalue(val)));
        }
        else {
          lua_Number d = 0.0;
          if (tonumberns(val, d)) {
            raviH_set_float_inline(L, h, u, d);
          }
          else
            luaG_runerror(L, "value cannot be converted to number");
        }
      }
    }
  }
  L->top = ci->top; /* correct top (in case of previous open call) */
}